

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.h
# Opt level: O0

FixedBuffer<4000000> * __thiscall
sznet::detail::FixedBuffer<4000000>::toString_abi_cxx11_(FixedBuffer<4000000> *this)

{
  int iVar1;
  FixedBuffer<4000000> *in_RSI;
  allocator local_19 [9];
  FixedBuffer<4000000> *this_local;
  
  this_local = this;
  iVar1 = length(in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,in_RSI->m_data,(long)iVar1,local_19);
  std::allocator<char>::~allocator((allocator<char> *)local_19);
  return this;
}

Assistant:

string toString() const
	{
		return string(m_data, length());
	}